

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void __thiscall FCommandBuffer::MakeStartPosGood(FCommandBuffer *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint local_14;
  uint cols;
  int n;
  FCommandBuffer *this_local;
  
  uVar2 = ConCols;
  local_14 = this->StartPos;
  uVar1 = active_con_scale();
  uVar2 = uVar2 / uVar1;
  uVar1 = this->StartPos;
  sVar3 = FString::Len(&this->Text);
  if (sVar3 <= uVar1) {
    local_14 = (this->CursorPos - uVar2) + 2;
  }
  if (uVar2 - 2 <= this->CursorPos - this->StartPos) {
    local_14 = (this->CursorPos - uVar2) + 2;
  }
  if (this->CursorPos < this->StartPos) {
    local_14 = this->CursorPos;
  }
  uVar1 = MAX<int>(0,local_14);
  this->StartPos = uVar1;
  return;
}

Assistant:

void MakeStartPosGood()
	{
		int n = StartPos;
		unsigned cols = ConCols / active_con_scale();

		if (StartPos >= Text.Len())
		{ // Start of visible line is beyond end of line
			n = CursorPos - cols + 2;
		}
		if ((CursorPos - StartPos) >= cols - 2)
		{ // The cursor is beyond the visible part of the line
			n = CursorPos - cols + 2;
		}
		if (StartPos > CursorPos)
		{ // The cursor is in front of the visible part of the line
			n = CursorPos;
		}
		StartPos = MAX(0, n);
	}